

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,BoundedZCIS input,MessageLite *msg,TcParseTableBase *tc_table,
          ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ParseFlags parse_flags_00;
  ParseContext *ctx_00;
  char *ptr;
  ParseContext ctx;
  ushort *local_b8;
  ushort *local_b0;
  internal *local_a8;
  int local_a0 [2];
  ParseContext local_98;
  
  ctx_00 = input._8_8_;
  local_a0[0] = (int)input.zcis;
  local_a8 = this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&local_98,io::CodedInputStream::default_recursion_limit_,false,(char **)&local_b0,
             (ZeroCopyInputStream **)&local_a8,local_a0);
  local_b8 = local_b0;
  while (bVar1 = ParseContext::Done(&local_98,(char **)&local_b8), !bVar1) {
    uVar2 = (uint)(byte)(msg->_internal_metadata_).ptr_ & (uint)*local_b8;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_b8 = (ushort *)
               (**(code **)((long)&msg[3]._internal_metadata_.ptr_ + uVar3 * 2))
                         (ctx_00,local_b8,&local_98,
                          (ulong)*local_b8 ^ *(ulong *)((long)&msg[4]._vptr_MessageLite + uVar3 * 2)
                          ,msg,0);
    if ((local_b8 == (ushort *)0x0) || (local_98.super_EpsCopyInputStream.last_tag_minus_1_ != 0))
    break;
  }
  if (((msg->_internal_metadata_).ptr_ & 0x100) == 0) {
    local_b0 = local_b8;
    if (local_b8 != (ushort *)0x0) goto LAB_001e4baa;
    TcParser::VerifyHasBitConsistency((MessageLite *)ctx_00,(TcParseTableBase *)msg);
    local_b0 = local_b8;
  }
  else {
    local_b0 = (ushort *)(*(code *)msg[2]._internal_metadata_.ptr_)(ctx_00,local_b8,&local_98);
  }
  if (local_b0 == (ushort *)0x0) {
    return false;
  }
LAB_001e4baa:
  EpsCopyInputStream::BackUp(&local_98.super_EpsCopyInputStream,(char *)local_b0);
  if (local_98.super_EpsCopyInputStream.last_tag_minus_1_ != 0) {
    return false;
  }
  bVar1 = anon_unknown_15::CheckFieldPresence
                    (ctx_00,(MessageLite *)((ulong)tc_table & 0xffffffff),parse_flags_00);
  return bVar1;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (ABSL_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}